

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void liblogger::LogManager::FilterAdd(ILogFilter *filter)

{
  shared_ptr<liblogger::ILogFilter> ptr;
  LogManagerScopedLock lock;
  ILogFilter *in_stack_ffffffffffffffb8;
  shared_ptr<liblogger::ILogFilter> *in_stack_ffffffffffffffc0;
  shared_ptr<liblogger::ILogFilter> *in_stack_ffffffffffffffd0;
  
  LogManagerScopedLock::LogManagerScopedLock((LogManagerScopedLock *)in_stack_ffffffffffffffc0);
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr<liblogger::ILogFilter,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr
            (in_stack_ffffffffffffffc0,(shared_ptr<liblogger::ILogFilter> *)&stack0xffffffffffffffc0
            );
  FilterAdd(in_stack_ffffffffffffffd0);
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x1a389c)
  ;
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x1a38a6)
  ;
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1a38b0);
  return;
}

Assistant:

void LogManager::FilterAdd(ILogFilter *filter)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::shared_ptr<ILogFilter> ptr(filter);
	FilterAdd(ptr);
}